

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void initState(LexerState *state)

{
  state->mode = LEXER_NORMAL;
  state->atLineStart = true;
  state->lastToken = 0;
  state->ifStack = (IfStack *)0x0;
  state->capturing = false;
  state->captureBuf = (char *)0x0;
  state->disableMacroArgs = false;
  state->disableInterpolation = false;
  state->macroArgScanDistance = 0;
  state->expandStrings = true;
  state->expansions = (Expansion *)0x0;
  return;
}

Assistant:

static void initState(struct LexerState *state)
{
	state->mode = LEXER_NORMAL;
	state->atLineStart = true; // yylex() will init colNo due to this
	state->lastToken = T_EOF;

	state->ifStack = NULL;

	state->capturing = false;
	state->captureBuf = NULL;

	state->disableMacroArgs = false;
	state->disableInterpolation = false;
	state->macroArgScanDistance = 0;
	state->expandStrings = true;
	state->expansions = NULL;
}